

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_print.c
# Opt level: O0

err_t cmdPrintDate(octet *date)

{
  bool_t bVar1;
  byte *in_RDI;
  err_t local_4;
  
  bVar1 = tmDateIsValid2(in_RDI);
  if (bVar1 == 0) {
    local_4 = 0x134;
  }
  else {
    printf("%c%c%c%c%c%c",(ulong)(*in_RDI + 0x30),(ulong)(in_RDI[1] + 0x30),
           (ulong)(in_RDI[2] + 0x30),(ulong)(in_RDI[3] + 0x30),(ulong)(in_RDI[4] + 0x30),
           in_RDI[5] + 0x30);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

err_t cmdPrintDate(const octet date[6])
{
	if (!tmDateIsValid2(date))
		return ERR_BAD_DATE;
	printf("%c%c%c%c%c%c",
		date[0] + '0', date[1] + '0', date[2] + '0',
		date[3] + '0', date[4] + '0', date[5] + '0');
	return ERR_OK;
}